

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

int do_op(void)

{
  int iVar1;
  uint local_14;
  int op;
  int val [2];
  
  iVar1 = op_idx + -1;
  local_14 = val_stack[val_idx];
  if (op_pri[(int)op_stack[op_idx]] < 9) {
    val_idx = val_idx + -1;
    op = val_stack[val_idx];
  }
  switch(op_stack[op_idx]) {
  case 2:
    local_14 = op + local_14;
    op_idx = iVar1;
    break;
  case 3:
    local_14 = op - local_14;
    op_idx = iVar1;
    break;
  case 4:
    local_14 = op * local_14;
    op_idx = iVar1;
    break;
  case 5:
    if (local_14 == 0) {
      op_idx = iVar1;
      error("Divide by zero!");
      return 0;
    }
    local_14 = op / (int)local_14;
    op_idx = iVar1;
    break;
  case 6:
    if (local_14 == 0) {
      op_idx = iVar1;
      error("Divide by zero!");
      return 0;
    }
    local_14 = op % (int)local_14;
    op_idx = iVar1;
    break;
  case 7:
    local_14 = -local_14;
    op_idx = iVar1;
    break;
  case 8:
    local_14 = op << ((byte)local_14 & 0x1f);
    op_idx = iVar1;
    break;
  case 9:
    local_14 = op >> ((byte)local_14 & 0x1f);
    op_idx = iVar1;
    break;
  case 10:
    local_14 = op | local_14;
    op_idx = iVar1;
    break;
  case 0xb:
    local_14 = op ^ local_14;
    op_idx = iVar1;
    break;
  case 0xc:
    local_14 = op & local_14;
    op_idx = iVar1;
    break;
  case 0xd:
    local_14 = local_14 ^ 0xffffffff;
    op_idx = iVar1;
    break;
  case 0xe:
    local_14 = (uint)((local_14 != 0 ^ 0xffU) & 1);
    op_idx = iVar1;
    break;
  case 0xf:
    local_14 = (uint)(op == local_14);
    op_idx = iVar1;
    break;
  case 0x10:
    local_14 = (uint)(op != local_14);
    op_idx = iVar1;
    break;
  case 0x11:
    local_14 = (uint)(op < (int)local_14);
    op_idx = iVar1;
    break;
  case 0x12:
    local_14 = (uint)(op <= (int)local_14);
    op_idx = iVar1;
    break;
  case 0x13:
    local_14 = (uint)((int)local_14 < op);
    op_idx = iVar1;
    break;
  case 0x14:
    local_14 = (uint)((int)local_14 <= op);
    op_idx = iVar1;
    break;
  case 0x15:
    op_idx = iVar1;
    iVar1 = check_func_args("DEFINED");
    if (iVar1 == 0) {
      return 0;
    }
    if ((expr_lablptr->type == 2) || (expr_lablptr->type == 1)) {
      local_14 = 0;
      undef = undef + -1;
    }
    else {
      local_14 = 1;
    }
    break;
  case 0x16:
    local_14 = (int)(local_14 & 0xff00) >> 8;
    op_idx = iVar1;
    break;
  case 0x17:
    local_14 = local_14 & 0xff;
    op_idx = iVar1;
    break;
  case 0x18:
    op_idx = iVar1;
    iVar1 = check_func_args("PAGE");
    if (iVar1 == 0) {
      return 0;
    }
    local_14 = expr_lablptr->page;
    break;
  case 0x19:
    op_idx = iVar1;
    iVar1 = check_func_args("BANK");
    if (iVar1 == 0) {
      return 0;
    }
    if ((pass == 1) && (expr_lablptr->bank == 0xf0)) {
      error("No BANK index for this symbol!");
      local_14 = 0;
    }
    else {
      local_14 = expr_lablptr->bank;
    }
    break;
  case 0x1a:
    op_idx = iVar1;
    iVar1 = check_func_args("VRAM");
    if (iVar1 == 0) {
      return 0;
    }
    if ((pass == 1) && (expr_lablptr->vram == -1)) {
      error("No VRAM address for this symbol!");
    }
    local_14 = expr_lablptr->vram;
    break;
  case 0x1b:
    op_idx = iVar1;
    iVar1 = check_func_args("PAL");
    if (iVar1 == 0) {
      return 0;
    }
    if ((pass == 1) && (expr_lablptr->pal == -1)) {
      error("No palette index for this symbol!");
    }
    local_14 = expr_lablptr->pal;
    break;
  case 0x1c:
    op_idx = iVar1;
    iVar1 = check_func_args("SIZEOF");
    if (iVar1 == 0) {
      return 0;
    }
    if ((pass == 1) && (expr_lablptr->data_type == -1)) {
      error("No size attributes for this symbol!");
      return 0;
    }
    local_14 = expr_lablptr->data_size;
    break;
  default:
    op_idx = iVar1;
    error("Invalid operator in expression!");
    return 0;
  }
  val_stack[val_idx] = local_14;
  return 1;
}

Assistant:

int
do_op(void)
{
	int val[2];
	int op;

	/* operator */
	op = op_stack[op_idx--];

	/* first arg */
	val[0] = val_stack[val_idx];

	/* second arg */
	if (op_pri[op] < 9)
		val[1] = val_stack[--val_idx];

	switch (op) {
	/* BANK */
	case OP_BANK:
		if (!check_func_args("BANK"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->bank == RESERVED_BANK) {
				error("No BANK index for this symbol!");
				val[0] = 0;
				break;
			}
		}
		val[0] = expr_lablptr->bank;
		break;

	/* PAGE */
	case OP_PAGE:
		if (!check_func_args("PAGE"))
			return (0);
		val[0] = expr_lablptr->page;
		break;

	/* VRAM */
	case OP_VRAM:
		if (!check_func_args("VRAM"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->vram == -1)
				error("No VRAM address for this symbol!");
		}
		val[0] = expr_lablptr->vram;
		break;

	/* PAL */
	case OP_PAL:
		if (!check_func_args("PAL"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->pal == -1)
				error("No palette index for this symbol!");
		}
		val[0] = expr_lablptr->pal;
		break;

	/* DEFINED */
	case OP_DEFINED:
		if (!check_func_args("DEFINED"))
			return (0);
		if ((expr_lablptr->type != IFUNDEF) && (expr_lablptr->type != UNDEF))
			val[0] = 1;
		else {
			val[0] = 0;
			undef--;
		}
		break;

	/* SIZEOF */
	case OP_SIZEOF:
		if (!check_func_args("SIZEOF"))
			return (0);
		if (pass == LAST_PASS) {
			if (expr_lablptr->data_type == -1) {
				error("No size attributes for this symbol!");
				return (0);
			}
		}
		val[0] = expr_lablptr->data_size;
		break;

	/* HIGH */
	case OP_HIGH:
		val[0] = (val[0] & 0xFF00) >> 8;
		break;

	/* LOW */
	case OP_LOW:
		val[0] = val[0] & 0xFF;
		break;

	case OP_ADD:
		val[0] = val[1] + val[0];
        break;

	case OP_SUB:
		val[0] = val[1] - val[0];
		break;

	case OP_MUL:
		val[0] = val[1] * val[0];
        break;

    case OP_DIV:
        if (val[0] == 0) {
			error("Divide by zero!");
			return (0);
		}
        val[0] = val[1] / val[0];
        break;

	case OP_MOD:
        if (val[0] == 0) {
			error("Divide by zero!");
			return (0);
		}
        val[0] = val[1] % val[0];
        break;

    case OP_NEG:
		val[0] = -val[0];
        break;

    case OP_SHL:
        val[0] = val[1] << (val[0] & 0x1F);
        break;

    case OP_SHR:
        val[0] = val[1] >> (val[0] & 0x1f);
        break;

	case OP_OR:
        val[0] = val[1] | val[0];
		break;

    case OP_XOR:
        val[0] = val[1] ^ val[0];
		break;

    case OP_AND:
        val[0] = val[1] & val[0];
        break;

    case OP_COM:
        val[0] = ~val[0];
        break;

    case OP_NOT:
        val[0] = !val[0];
        break;

    case OP_EQUAL:
        val[0] = (val[1] == val[0]);
        break;

    case OP_NOT_EQUAL:
        val[0] = (val[1] != val[0]);
        break;

    case OP_LOWER:
        val[0] = (val[1] < val[0]);
        break;

    case OP_LOWER_EQUAL:
        val[0] = (val[1] <= val[0]);
        break;

    case OP_HIGHER:
        val[0] = (val[1] > val[0]);
        break;

    case OP_HIGHER_EQUAL:
        val[0] = (val[1] >= val[0]);
        break;

    default:
		error("Invalid operator in expression!");
		return (0);
    }

	/* result */
    val_stack[val_idx] = val[0];
    return (1);
}